

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_get_b32(uchar *bin,secp256k1_scalar *a)

{
  secp256k1_scalar *in_RSI;
  uchar *in_RDI;
  
  secp256k1_scalar_verify(in_RSI);
  secp256k1_write_be64(in_RDI,in_RSI->d[3]);
  secp256k1_write_be64(in_RDI + 8,in_RSI->d[2]);
  secp256k1_write_be64(in_RDI + 0x10,in_RSI->d[1]);
  secp256k1_write_be64(in_RDI + 0x18,in_RSI->d[0]);
  return;
}

Assistant:

static void secp256k1_scalar_get_b32(unsigned char *bin, const secp256k1_scalar* a) {
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_write_be64(&bin[0],  a->d[3]);
    secp256k1_write_be64(&bin[8],  a->d[2]);
    secp256k1_write_be64(&bin[16], a->d[1]);
    secp256k1_write_be64(&bin[24], a->d[0]);
}